

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boards.cpp
# Opt level: O0

void __thiscall Boards::noCheckPut(Boards *this,int x,int y,int turn)

{
  reference this_00;
  reference pvVar1;
  reference pvVar2;
  reference pvVar3;
  int local_20;
  int i;
  int turn_local;
  int y_local;
  int x_local;
  Boards *this_local;
  
  local_20 = 0;
  this_00 = std::array<std::array<int,_16UL>,_16UL>::operator[](&this->board,(long)x);
  pvVar1 = std::array<int,_16UL>::operator[](this_00,(long)y);
  *pvVar1 = turn;
  while( true ) {
    pvVar2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&this->delta,(long)local_20);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,0);
    if (*pvVar3 == 0) break;
    local_20 = local_20 + 1;
  }
  pvVar2 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[](&this->delta,(long)local_20);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,0);
  *pvVar3 = turn;
  pvVar2 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[](&this->delta,(long)local_20);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,1);
  *pvVar3 = x;
  pvVar2 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[](&this->delta,(long)local_20);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,2);
  *pvVar3 = y;
  return;
}

Assistant:

void Boards::noCheckPut(int x, int y, int turn){
	int i = 0;
	board[x][y] = turn;
	while(delta[i][0]){ i++; }
	delta[i][0] = turn;
	delta[i][1] = x;
	delta[i][2] = y;
}